

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O0

RK_U8 * mpp_align_get_bits(BitReadCtx_t *bitctx)

{
  int n;
  BitReadCtx_t *bitctx_local;
  
  if (bitctx->num_remaining_bits_in_curr_byte_ != 0) {
    mpp_skip_bits(bitctx,bitctx->num_remaining_bits_in_curr_byte_);
  }
  return bitctx->data_;
}

Assistant:

RK_U8 *mpp_align_get_bits(BitReadCtx_t *bitctx)
{
    int n = bitctx->num_remaining_bits_in_curr_byte_;
    if (n)
        mpp_skip_bits(bitctx, n);
    return bitctx->data_;
}